

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::PointSourcePannerDownmix::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          PointSourcePannerDownmix *this,Vector3d *position)

{
  bool bVar1;
  element_type *peVar2;
  reference_type other;
  RealScalar local_98;
  non_const_type local_90;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_88 [2];
  undefined1 local_68 [8];
  VectorXd _pv;
  undefined1 local_40 [8];
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  Vector3d *position_local;
  PointSourcePannerDownmix *this_local;
  
  pv.super_type.m_storage.dummy_._8_8_ = position;
  peVar2 = std::
           __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_psp);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             position);
  (**peVar2->_vptr_PointSourcePanner)
            (local_40,peVar2,
             &_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  bVar1 = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator!
                    ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional(__return_storage_ptr__);
  }
  else {
    other = boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                      ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_68,other);
    local_90 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_downmix);
    local_88[0] = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                  operator*((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                            &local_90,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_68,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_88);
    local_98 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68,&local_98);
    boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional
              (__return_storage_ptr__,(rval_reference_type)local_68);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_68);
  }
  boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional
            ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> PointSourcePannerDownmix::handle(
      Eigen::Vector3d position) {
    boost::optional<Eigen::VectorXd> pv = _psp->handle(position);
    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      _pv = _downmix.transpose() * _pv;
      _pv /= _pv.norm();
      return _pv;
    }
    return boost::none;
  }